

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfPub.c
# Opt level: O1

void sbfPubRemoveEventCb(int fd,short events,void *closure)

{
  int *piVar1;
  long lVar2;
  long *__ptr;
  undefined8 *__ptr_00;
  undefined8 uVar3;
  long lVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  char *pcVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long *plVar11;
  int iVar12;
  undefined8 *puVar13;
  long *plVar14;
  bool bVar15;
  
  lVar2 = *(long *)((long)closure + 0x18);
  if (*(int *)((long)closure + 0x14) == 0) {
    *(undefined4 *)((long)closure + 0xc) = 1;
    uVar3 = *(undefined8 *)(lVar2 + 8);
    pcVar7 = sbfTopic_getTopic(*closure);
    sbfLog_log(uVar3,0,"not removing publisher %p (%s); not ready",closure,pcVar7);
    return;
  }
  __ptr = *(long **)((long)closure + 0x20);
  __ptr_00 = *(undefined8 **)((long)closure + 0x28);
  uVar3 = *(undefined8 *)(lVar2 + 8);
  pcVar7 = sbfTopic_getTopic(*closure);
  sbfLog_log(uVar3,0,"removing publisher %p (%s) (stream %p)",closure,pcVar7,__ptr);
  lVar9 = *(long *)((long)closure + 0x158);
  puVar13 = (undefined8 *)(lVar9 + 0x160);
  if (lVar9 == 0) {
    puVar13 = __ptr_00 + 2;
  }
  *puVar13 = *(undefined8 *)((long)closure + 0x160);
  **(long **)((long)closure + 0x160) = lVar9;
  if (__ptr_00[1] != 0) goto LAB_00104008;
  sbfLog_log(*(undefined8 *)(*__ptr + 8),0,"removing topic %p",__ptr_00);
  LOCK();
  plVar11 = __ptr + 3;
  *(int *)plVar11 = (int)*plVar11 + -1;
  bVar15 = (int)*plVar11 != 0;
  UNLOCK();
  plVar11 = __ptr + 4;
  lVar9 = __ptr_00[0xb];
  lVar8 = lVar9;
  if ((__ptr_00[10] == 0) || (lVar8 = __ptr_00[10], lVar9 == 0)) {
    lVar9 = __ptr_00[0xc];
    iVar12 = *(int *)(__ptr_00 + 0xd);
    if (lVar8 != 0) {
      *(long *)(lVar8 + 0x60) = lVar9;
    }
    if (lVar9 == 0) {
      lVar9 = 0;
      plVar14 = plVar11;
    }
    else {
      plVar14 = (long *)(lVar9 + 0x58);
      if (*(undefined8 **)(lVar9 + 0x50) == __ptr_00) {
        plVar14 = (long *)(lVar9 + 0x50);
      }
    }
    *plVar14 = lVar8;
  }
  else {
    do {
      lVar10 = lVar9;
      lVar9 = *(long *)(lVar10 + 0x50);
    } while (*(long *)(lVar10 + 0x50) != 0);
    lVar8 = *(long *)(lVar10 + 0x58);
    lVar9 = *(long *)(lVar10 + 0x60);
    iVar12 = *(int *)(lVar10 + 0x68);
    if (lVar8 != 0) {
      *(long *)(lVar8 + 0x60) = lVar9;
    }
    plVar14 = plVar11;
    if (lVar9 != 0) {
      plVar14 = (long *)(lVar9 + 0x58);
      if (*(long *)(lVar9 + 0x50) == lVar10) {
        plVar14 = (long *)(lVar9 + 0x50);
      }
    }
    *plVar14 = lVar8;
    if (*(undefined8 **)(lVar10 + 0x60) == __ptr_00) {
      lVar9 = lVar10;
    }
    uVar3 = __ptr_00[10];
    uVar5 = __ptr_00[0xb];
    uVar6 = __ptr_00[0xd];
    *(undefined8 *)(lVar10 + 0x60) = __ptr_00[0xc];
    *(undefined8 *)(lVar10 + 0x68) = uVar6;
    *(undefined8 *)(lVar10 + 0x50) = uVar3;
    *(undefined8 *)(lVar10 + 0x58) = uVar5;
    lVar4 = __ptr_00[0xc];
    plVar14 = plVar11;
    if (lVar4 != 0) {
      plVar14 = (long *)(lVar4 + 0x58);
      if (*(undefined8 **)(lVar4 + 0x50) == __ptr_00) {
        plVar14 = (long *)(lVar4 + 0x50);
      }
    }
    *plVar14 = lVar10;
    *(long *)(__ptr_00[10] + 0x60) = lVar10;
    lVar4 = lVar9;
    if (__ptr_00[0xb] != 0) {
      *(long *)(__ptr_00[0xb] + 0x60) = lVar10;
    }
    for (; lVar4 != 0; lVar4 = *(long *)(lVar4 + 0x60)) {
    }
  }
  if (iVar12 == 0) {
    do {
      if (((lVar8 != 0) && (*(int *)(lVar8 + 0x68) != 0)) || (lVar8 == *plVar11)) goto LAB_00103f45;
      lVar10 = *(long *)(lVar9 + 0x50);
      if (lVar10 == lVar8) {
        lVar10 = *(long *)(lVar9 + 0x58);
        if (*(int *)(lVar10 + 0x68) == 1) {
          *(undefined4 *)(lVar10 + 0x68) = 0;
          *(undefined4 *)(lVar9 + 0x68) = 1;
          lVar8 = *(long *)(lVar10 + 0x50);
          *(long *)(lVar9 + 0x58) = lVar8;
          if (lVar8 != 0) {
            *(long *)(lVar8 + 0x60) = lVar9;
          }
          lVar8 = *(long *)(lVar9 + 0x60);
          *(long *)(lVar10 + 0x60) = lVar8;
          plVar14 = plVar11;
          if (lVar8 != 0) {
            lVar8 = *(long *)(lVar9 + 0x60);
            plVar14 = (long *)(lVar8 + 0x58);
            if (lVar9 == *(long *)(lVar8 + 0x50)) {
              plVar14 = (long *)(lVar8 + 0x50);
            }
          }
          *plVar14 = lVar10;
          *(long *)(lVar10 + 0x50) = lVar9;
          *(long *)(lVar9 + 0x60) = lVar10;
          lVar10 = *(long *)(lVar9 + 0x58);
        }
        lVar8 = *(long *)(lVar10 + 0x50);
        if (((lVar8 != 0) && (*(int *)(lVar8 + 0x68) != 0)) ||
           ((*(long *)(lVar10 + 0x58) != 0 && (*(int *)(*(long *)(lVar10 + 0x58) + 0x68) != 0)))) {
          if ((*(long *)(lVar10 + 0x58) == 0) || (*(int *)(*(long *)(lVar10 + 0x58) + 0x68) == 0)) {
            if (lVar8 != 0) {
              *(undefined4 *)(lVar8 + 0x68) = 0;
            }
            *(undefined4 *)(lVar10 + 0x68) = 1;
            lVar4 = *(long *)(lVar8 + 0x58);
            *(long *)(lVar10 + 0x50) = lVar4;
            if (lVar4 != 0) {
              *(long *)(lVar4 + 0x60) = lVar10;
            }
            lVar4 = *(long *)(lVar10 + 0x60);
            *(long *)(lVar8 + 0x60) = lVar4;
            plVar14 = plVar11;
            if (lVar4 != 0) {
              lVar4 = *(long *)(lVar10 + 0x60);
              plVar14 = (long *)(lVar4 + 0x58);
              if (lVar10 == *(long *)(lVar4 + 0x50)) {
                plVar14 = (long *)(lVar4 + 0x50);
              }
            }
            *plVar14 = lVar8;
            *(long *)(lVar8 + 0x58) = lVar10;
            *(long *)(lVar10 + 0x60) = lVar8;
            lVar10 = *(long *)(lVar9 + 0x58);
          }
          *(undefined4 *)(lVar10 + 0x68) = *(undefined4 *)(lVar9 + 0x68);
          *(undefined4 *)(lVar9 + 0x68) = 0;
          if (*(long *)(lVar10 + 0x58) != 0) {
            *(undefined4 *)(*(long *)(lVar10 + 0x58) + 0x68) = 0;
          }
          lVar8 = *(long *)(lVar9 + 0x58);
          lVar10 = *(long *)(lVar8 + 0x50);
          *(long *)(lVar9 + 0x58) = lVar10;
          if (lVar10 != 0) {
            *(long *)(lVar10 + 0x60) = lVar9;
          }
          lVar10 = *(long *)(lVar9 + 0x60);
          *(long *)(lVar8 + 0x60) = lVar10;
          plVar14 = plVar11;
          if (lVar10 != 0) {
            lVar10 = *(long *)(lVar9 + 0x60);
            plVar14 = (long *)(lVar10 + 0x58);
            if (lVar9 == *(long *)(lVar10 + 0x50)) {
              plVar14 = (long *)(lVar10 + 0x50);
            }
          }
          *plVar14 = lVar8;
          *(long *)(lVar8 + 0x50) = lVar9;
          goto LAB_00103f3e;
        }
      }
      else {
        if (*(int *)(lVar10 + 0x68) == 1) {
          *(undefined4 *)(lVar10 + 0x68) = 0;
          *(undefined4 *)(lVar9 + 0x68) = 1;
          lVar8 = *(long *)(lVar10 + 0x58);
          *(long *)(lVar9 + 0x50) = lVar8;
          if (lVar8 != 0) {
            *(long *)(lVar8 + 0x60) = lVar9;
          }
          lVar8 = *(long *)(lVar9 + 0x60);
          *(long *)(lVar10 + 0x60) = lVar8;
          plVar14 = plVar11;
          if (lVar8 != 0) {
            lVar8 = *(long *)(lVar9 + 0x60);
            plVar14 = (long *)(lVar8 + 0x58);
            if (lVar9 == *(long *)(lVar8 + 0x50)) {
              plVar14 = (long *)(lVar8 + 0x50);
            }
          }
          *plVar14 = lVar10;
          *(long *)(lVar10 + 0x58) = lVar9;
          *(long *)(lVar9 + 0x60) = lVar10;
          lVar10 = *(long *)(lVar9 + 0x50);
        }
        lVar8 = *(long *)(lVar10 + 0x50);
        if (((lVar8 != 0) && (*(int *)(lVar8 + 0x68) != 0)) ||
           ((*(long *)(lVar10 + 0x58) != 0 && (*(int *)(*(long *)(lVar10 + 0x58) + 0x68) != 0))))
        goto LAB_00103db3;
      }
      *(undefined4 *)(lVar10 + 0x68) = 1;
      lVar8 = lVar9;
      lVar9 = *(long *)(lVar9 + 0x60);
    } while( true );
  }
  goto LAB_00103f51;
LAB_00103db3:
  if ((lVar8 == 0) || (*(int *)(lVar8 + 0x68) == 0)) {
    lVar8 = *(long *)(lVar10 + 0x58);
    if (lVar8 != 0) {
      *(undefined4 *)(lVar8 + 0x68) = 0;
    }
    *(undefined4 *)(lVar10 + 0x68) = 1;
    lVar4 = *(long *)(lVar8 + 0x50);
    *(long *)(lVar10 + 0x58) = lVar4;
    if (lVar4 != 0) {
      *(long *)(lVar4 + 0x60) = lVar10;
    }
    lVar4 = *(long *)(lVar10 + 0x60);
    *(long *)(lVar8 + 0x60) = lVar4;
    plVar14 = plVar11;
    if (lVar4 != 0) {
      lVar4 = *(long *)(lVar10 + 0x60);
      plVar14 = (long *)(lVar4 + 0x58);
      if (lVar10 == *(long *)(lVar4 + 0x50)) {
        plVar14 = (long *)(lVar4 + 0x50);
      }
    }
    *plVar14 = lVar8;
    *(long *)(lVar8 + 0x50) = lVar10;
    *(long *)(lVar10 + 0x60) = lVar8;
    lVar10 = *(long *)(lVar9 + 0x50);
  }
  *(undefined4 *)(lVar10 + 0x68) = *(undefined4 *)(lVar9 + 0x68);
  *(undefined4 *)(lVar9 + 0x68) = 0;
  if (*(long *)(lVar10 + 0x50) != 0) {
    *(undefined4 *)(*(long *)(lVar10 + 0x50) + 0x68) = 0;
  }
  lVar8 = *(long *)(lVar9 + 0x50);
  lVar10 = *(long *)(lVar8 + 0x58);
  *(long *)(lVar9 + 0x50) = lVar10;
  if (lVar10 != 0) {
    *(long *)(lVar10 + 0x60) = lVar9;
  }
  lVar10 = *(long *)(lVar9 + 0x60);
  *(long *)(lVar8 + 0x60) = lVar10;
  plVar14 = plVar11;
  if (lVar10 != 0) {
    lVar10 = *(long *)(lVar9 + 0x60);
    plVar14 = (long *)(lVar10 + 0x58);
    if (lVar9 == *(long *)(lVar10 + 0x50)) {
      plVar14 = (long *)(lVar10 + 0x50);
    }
  }
  *plVar14 = lVar8;
  *(long *)(lVar8 + 0x58) = lVar9;
LAB_00103f3e:
  *(long *)(lVar9 + 0x60) = lVar8;
  lVar8 = *plVar11;
LAB_00103f45:
  if (lVar8 != 0) {
    *(undefined4 *)(lVar8 + 0x68) = 0;
  }
LAB_00103f51:
  if (bVar15) {
    free((void *)*__ptr_00);
    free(__ptr_00);
  }
  else {
    if (*plVar11 != 0) {
      __assert_fail("!empty || ((&tstream->mTopics)->rbh_root == ((void*)0))",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/blu-corner[P]sbf/src/transport/sbfTportPrivate.h"
                    ,0xc5,"int sbfTport_removeTopic(sbfTportStream, sbfTportTopic)");
    }
    free((void *)*__ptr_00);
    free(__ptr_00);
    if (!bVar15) {
      pthread_mutex_lock((pthread_mutex_t *)(lVar2 + 0x180));
      if ((int)__ptr[3] == 0) {
        sbfLog_log(*(undefined8 *)(lVar2 + 8),0,"removing stream %p",__ptr);
        lVar9 = __ptr[10];
        plVar11 = (long *)(lVar9 + 0x58);
        if (lVar9 == 0) {
          plVar11 = (long *)(lVar2 + 0x178);
        }
        *plVar11 = __ptr[0xb];
        *(long *)__ptr[0xb] = lVar9;
        (**(code **)(*(long *)(lVar2 + 0x20) + 0x28))(__ptr[2]);
        pthread_mutex_destroy((pthread_mutex_t *)(__ptr + 5));
        free(__ptr);
      }
      pthread_mutex_unlock((pthread_mutex_t *)(lVar2 + 0x180));
    }
  }
LAB_00104008:
  LOCK();
  piVar1 = (int *)((long)closure + 0x10);
  *piVar1 = *piVar1 + -1;
  UNLOCK();
  if (*piVar1 != 0) {
    return;
  }
  free(*(void **)((long)closure + 0x148));
  sbfTopic_destroy(*closure);
  free(closure);
  return;
}

Assistant:

static void
sbfPubRemoveEventCb (int fd, short events, void* closure)
{
    sbfPub         pub0 = closure;
    sbfTport       tport = pub0->mTport;
    sbfTportStream tstream = pub0->mTportStream;
    sbfTportTopic  ttopic = pub0->mTportTopic;

    /*
     * If the pub is waiting for the stream to be added, the remove event could
     * be fired before it is ready. If so, defer the remove until the add
     * stream complete callback. The flag is set so the later callback knows
     * this callback has already fired and isn't queued behind it.
     */
    if (!pub0->mReady)
    {
        pub0->mRemoved = 1;
        sbfLog_debug (tport->mLog,
                      "not removing publisher %p (%s); not ready",
                      pub0,
                      sbfTopic_getTopic (pub0->mTopic));
        return;
    }

    sbfLog_debug (tport->mLog,
                  "removing publisher %p (%s) (stream %p)",
                  pub0,
                  sbfTopic_getTopic (pub0->mTopic),
                  tstream);

    TAILQ_REMOVE (&ttopic->mPubs, pub0, mEntry);
    if (TAILQ_EMPTY (&ttopic->mPubs) && sbfTport_removeTopic (tstream, ttopic))
    {
        sbfMutex_lock (&tport->mStreamsLock);
        /*
         * Reference count could be bumped between removeTopic (outside the
         * lock) and here.
         */
        if (sbfRefCount_get (&tstream->mRefCount) == 0)
            sbfTport_removeStream (tport, tstream);
        sbfMutex_unlock (&tport->mStreamsLock);
    }

    if (sbfRefCount_decrement (&pub0->mRefCount))
        sbfPubFree (pub0);
}